

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

bool __thiscall smf::MidiMessage::isSustainOn(MidiMessage *this)

{
  pointer puVar1;
  bool bVar2;
  
  bVar2 = isSustain(this);
  if ((bVar2) &&
     (puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
     2 < (ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1))) {
    bVar2 = 0x3f < puVar1[2];
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MidiMessage::isSustainOn(void) const {
	if (!isSustain()) {
		return false;
	}
	if (getP2() >= 64) {
		return true;
	} else {
		return false;
	}
}